

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int runAI(void)

{
  int iVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  
  boyi_max_x = -1;
  boyi_max_y = -1;
  boyi_search((char)chess_num[0],(char)chess_num[1],chessboard,(char)AI_COLOR,'\x01',-2000000,
              2000000);
  bVar4 = boyi_max_x != -1;
  if (bVar4) {
    printf("%c%c\n",(ulong)(boyi_max_x + 0x31),(ulong)(boyi_max_y + 0x61));
    iVar1 = AI_COLOR;
    lVar3 = (long)boyi_max_x;
    lVar2 = (long)boyi_max_y;
    canrev(boyi_max_x,boyi_max_y,chessboard,AI_COLOR,1);
    chessboard[lVar3][lVar2] = (char)iVar1;
    chess_num[iVar1 - 4] = chess_num[iVar1 - 4] + 1;
    refresh();
  }
  return (uint)bVar4;
}

Assistant:

int runAI() {
    boyi_max_x = -1;
    boyi_max_y = -1;
    boyi_search(chess_num[0], chess_num[1], chessboard, AI_COLOR, 1, -2000000, 2000000);
/*#ifdef AI_COLOR_BLACK
	boyi_search(chess_num[0], chess_num[1], chessboard, BLACK, 1, -2000000, 2000000);
#endif
#ifdef AI_COLOR_WHITE
	boyi_search(chess_num[0], chess_num[1], chessboard, WHITE, 1, -2000000, 2000000);
#endif*/
    if (boyi_max_x == -1) {
        return 0;//AI can't move
    }
    printf("%c%c\n", boyi_max_x + '1', boyi_max_y + 'a');
    putchess(boyi_max_x, boyi_max_y, AI_COLOR);
/*#ifdef AI_COLOR_BLACK
	putchess(boyi_max_x, boyi_max_y, BLACK);
#endif
#ifdef AI_COLOR_WHITE
	putchess(boyi_max_x, boyi_max_y, WHITE);
#endif*/
    refresh();
    return 1;
}